

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O3

void __thiscall QLayout::~QLayout(QLayout *this)

{
  long lVar1;
  QWidget *pQVar2;
  QLayout *pQVar3;
  
  *(undefined ***)this = &PTR_metaObject_007e6b00;
  (this->super_QLayoutItem)._vptr_QLayoutItem = (_func_int **)&PTR__QLayout_007e6c00;
  if ((((*(byte *)(*(long *)&this->field_0x8 + 0x8c) & 1) != 0) &&
      (lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x10), lVar1 != 0)) &&
     ((*(byte *)(*(long *)(lVar1 + 8) + 0x30) & 1) != 0)) {
    pQVar2 = parentWidget(this);
    pQVar3 = QWidget::layout(pQVar2);
    if (pQVar3 == this) {
      pQVar2 = parentWidget(this);
      *(undefined8 *)(*(long *)&pQVar2->field_0x8 + 0x98) = 0;
      goto LAB_002ead86;
    }
  }
  pQVar3 = (QLayout *)QMetaObject::cast((QObject *)&staticMetaObject);
  if (pQVar3 != (QLayout *)0x0) {
    removeItem(pQVar3,&this->super_QLayoutItem);
  }
LAB_002ead86:
  QLayoutItem::~QLayoutItem(&this->super_QLayoutItem);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QLayout::~QLayout()
{
    Q_D(QLayout);
    if (d->topLevel && parent() && parent()->isWidgetType() && parentWidget()->layout() == this)
        parentWidget()->d_func()->layout = nullptr;
    else if (QLayout *parentLayout = qobject_cast<QLayout *>(parent()))
        parentLayout->removeItem(this);
}